

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O2

int64_t get_clock(void)

{
  int64_t iVar1;
  timespec ts;
  
  if (use_rt_clock == 0) {
    gettimeofday((timeval *)&ts,(__timezone_ptr_t)0x0);
    iVar1 = ts.tv_nsec * 1000 + ts.tv_sec * 1000000000;
  }
  else {
    clock_gettime(1,(timespec *)&ts);
    iVar1 = ts.tv_sec * 1000000000 + ts.tv_nsec;
  }
  return iVar1;
}

Assistant:

static inline int64_t get_clock(void)
{
    if (use_rt_clock) {
        struct timespec ts;
        clock_gettime(CLOCK_MONOTONIC, &ts);
        return ts.tv_sec * 1000000000LL + ts.tv_nsec;
    } else {
        /* XXX: using gettimeofday leads to problems if the date
           changes, so it should be avoided. */
        return get_clock_realtime();
    }
}